

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O1

SUNErrCode SUNQRAdd_MGS(N_Vector *Q,sunrealtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  int iVar1;
  long lVar2;
  sunrealtype sVar3;
  double dVar4;
  
  N_VScale(1.0,df,*QRdata);
  if (0 < m) {
    lVar2 = 0;
    do {
      sVar3 = N_VDotProd(Q[lVar2],*QRdata);
      R[mMax * m + lVar2] = sVar3;
      N_VLinearSum(1.0,*QRdata,-sVar3,Q[lVar2],*QRdata);
      lVar2 = lVar2 + 1;
    } while (m != lVar2);
  }
  sVar3 = N_VDotProd(*QRdata,*QRdata);
  iVar1 = (mMax + 1) * m;
  R[iVar1] = sVar3;
  dVar4 = 0.0;
  if (0.0 < sVar3) {
    if (sVar3 < 0.0) {
      dVar4 = sqrt(sVar3);
    }
    else {
      dVar4 = SQRT(sVar3);
    }
  }
  R[iVar1] = dVar4;
  N_VScale(1.0 / dVar4,*QRdata,Q[m]);
  return 0;
}

Assistant:

SUNErrCode SUNQRAdd_MGS(N_Vector* Q, sunrealtype* R, N_Vector df, int m,
                        int mMax, void* QRdata)
{
  SUNFunctionBegin(Q[0]->sunctx);

  sunindextype j;
  SUNQRData qrdata = (SUNQRData)QRdata;

  N_VScale(ONE, df, qrdata->vtemp);
  SUNCheckLastErr();
  for (j = 0; j < m; j++)
  {
    R[m * mMax + j] = N_VDotProd(Q[j], qrdata->vtemp);
    SUNCheckLastErr();
    N_VLinearSum(ONE, qrdata->vtemp, -R[m * mMax + j], Q[j], qrdata->vtemp);
    SUNCheckLastErr();
  }
  R[m * mMax + m] = N_VDotProd(qrdata->vtemp, qrdata->vtemp);
  SUNCheckLastErr();
  R[m * mMax + m] = SUNRsqrt(R[m * mMax + m]);
  N_VScale((1 / R[m * mMax + m]), qrdata->vtemp, Q[m]);
  SUNCheckLastErr();

  return SUN_SUCCESS;
}